

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

void write_intra_prediction_modes(AV1_COMMON *cm,MACROBLOCKD *xd,int is_keyframe,aom_writer *w)

{
  od_ec_enc *poVar1;
  BLOCK_SIZE BVar2;
  uint8_t uVar3;
  ushort uVar4;
  aom_bit_depth_t aVar5;
  FRAME_CONTEXT *pFVar6;
  MB_MODE_INFO *pMVar7;
  MB_MODE_INFO *left_mi;
  short sVar8;
  aom_cdf_prob (*paaVar9) [14];
  byte bVar10;
  byte bVar11;
  byte bVar12;
  ushort uVar13;
  uint16_t *icdf;
  aom_cdf_prob (*icdf_00) [17];
  aom_cdf_prob (*paaVar14) [3];
  long lVar15;
  ulong uVar16;
  int iVar17;
  aom_cdf_prob (*paaVar18) [8];
  int iVar19;
  uint uVar20;
  aom_cdf_prob (*paaVar21) [14];
  aom_cdf_prob *paVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  int min_bits_v;
  uint8_t cache_color_found [16];
  int zero_count;
  int out_cache_colors [8];
  uint16_t color_cache [16];
  uint local_e0;
  undefined4 local_9c;
  byte local_98 [28];
  int local_7c;
  int local_78 [8];
  uint16_t local_58 [20];
  
  pFVar6 = xd->tile_ctx;
  pMVar7 = *xd->mi;
  bVar12 = pMVar7->mode;
  lVar25 = (long)(char)bVar12;
  BVar2 = pMVar7->bsize;
  if (is_keyframe == 0) {
    bVar10 = ""[BVar2];
    paaVar21 = pFVar6->y_mode_cdf + bVar10;
    od_ec_encode_cdf_q15(&w->ec,(uint)bVar12,*paaVar21,0xd);
    if (w->allow_update_cdf == '\0') goto LAB_0019cf22;
    paaVar9 = pFVar6->y_mode_cdf + bVar10;
    uVar13 = pFVar6->y_mode_cdf[bVar10][0xd];
    bVar10 = (char)(uVar13 >> 4) + 5;
    lVar15 = 0;
    do {
      uVar4 = (*paaVar21)[lVar15];
      if (lVar15 < (char)bVar12) {
        sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar10 & 0x1f));
      }
      else {
        sVar8 = -(uVar4 >> (bVar10 & 0x1f));
      }
      (*paaVar21)[lVar15] = sVar8 + uVar4;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0xc);
  }
  else {
    left_mi = xd->left_mbmi;
    bVar10 = av1_above_block_mode(xd->above_mbmi);
    bVar11 = av1_left_block_mode(left_mi);
    iVar19 = intra_mode_context[bVar10];
    iVar17 = intra_mode_context[bVar11];
    paaVar21 = pFVar6->kf_y_cdf[iVar19] + iVar17;
    od_ec_encode_cdf_q15(&w->ec,(uint)bVar12,*paaVar21,0xd);
    if (w->allow_update_cdf == '\0') goto LAB_0019cf22;
    paaVar9 = pFVar6->kf_y_cdf[iVar19] + iVar17;
    uVar13 = pFVar6->kf_y_cdf[iVar19][iVar17][0xd];
    bVar10 = (char)(uVar13 >> 4) + 5;
    lVar15 = 0;
    do {
      uVar4 = (*paaVar21)[lVar15];
      if (lVar15 < lVar25) {
        sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar10 & 0x1f));
      }
      else {
        sVar8 = -(uVar4 >> (bVar10 & 0x1f));
      }
      (*paaVar21)[lVar15] = sVar8 + uVar4;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0xc);
  }
  (*paaVar9)[0xd] = (*paaVar9)[0xd] + (ushort)(uVar13 < 0x20);
LAB_0019cf22:
  if ((BLOCK_8X4 < BVar2) && (0xf7 < (byte)(bVar12 - 9))) {
    paaVar18 = pFVar6->angle_delta_cdf + lVar25 + -1;
    iVar19 = pMVar7->angle_delta[0] + 3;
    od_ec_encode_cdf_q15(&w->ec,iVar19,*paaVar18,7);
    if (w->allow_update_cdf != '\0') {
      uVar13 = pFVar6->angle_delta_cdf[lVar25 + -1][7];
      bVar10 = (char)(uVar13 >> 4) + 5;
      lVar15 = 0;
      do {
        uVar4 = (*paaVar18)[lVar15];
        if (lVar15 < (char)iVar19) {
          sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar10 & 0x1f));
        }
        else {
          sVar8 = -(uVar4 >> (bVar10 & 0x1f));
        }
        (*paaVar18)[lVar15] = sVar8 + uVar4;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 6);
      paVar22 = pFVar6->angle_delta_cdf[lVar25 + -1] + 7;
      *paVar22 = *paVar22 + (ushort)(uVar13 < 0x20);
    }
  }
  if ((cm->seq_params->monochrome == '\0') && (xd->is_chroma_ref == true)) {
    bVar10 = pMVar7->uv_mode;
    uVar16 = (ulong)(*xd->mi)->bsize;
    if (xd->lossless[*(ushort *)&(*xd->mi)->field_0xa7 & 7] == 0) {
      bVar27 = (0x2f0bffUL >> (uVar16 & 0x3f) & 1) != 0;
      if ((0x1f07ffUL >> (uVar16 & 0x3f) & 1) == 0) {
        bVar27 = false;
      }
    }
    else {
      bVar27 = av1_ss_size_lookup[uVar16][xd->plane[1].subsampling_x][xd->plane[1].subsampling_y] ==
               BLOCK_4X4;
    }
    icdf = (uint16_t *)
           ((long)pFVar6 +
           (ulong)bVar12 * 0x20 + (ulong)bVar12 * -2 + (ulong)bVar27 * 0x186 + 0x3226);
    uVar20 = -(uint)(bVar27 == false) + 0xe;
    poVar1 = &w->ec;
    od_ec_encode_cdf_q15(poVar1,(uint)bVar10,icdf,uVar20);
    if (w->allow_update_cdf != '\0') {
      uVar13 = icdf[uVar20];
      bVar12 = (char)(uVar13 >> 4) + 5;
      uVar16 = 0;
      do {
        uVar4 = icdf[uVar16];
        if ((long)uVar16 < (long)(char)bVar10) {
          sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar12 & 0x1f));
        }
        else {
          sVar8 = -(uVar4 >> (bVar12 & 0x1f));
        }
        icdf[uVar16] = sVar8 + uVar4;
        uVar16 = uVar16 + 1;
      } while (-(uint)(bVar27 == false) + 0xd != uVar16);
      icdf[uVar20] = icdf[uVar20] + (ushort)(uVar13 < 0x20);
    }
    if (bVar10 == 0xd) {
      bVar12 = pMVar7->cfl_alpha_idx;
      iVar19 = (int)pMVar7->cfl_alpha_signs;
      lVar25 = (long)iVar19;
      paVar22 = pFVar6->cfl_sign_cdf;
      od_ec_encode_cdf_q15(poVar1,iVar19,paVar22,8);
      if (w->allow_update_cdf != '\0') {
        uVar13 = pFVar6->cfl_sign_cdf[8];
        bVar11 = (char)(uVar13 >> 4) + 5;
        lVar15 = 0;
        do {
          uVar4 = paVar22[lVar15];
          if (lVar15 < lVar25) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar11 & 0x1f));
          }
          else {
            sVar8 = -(uVar4 >> (bVar11 & 0x1f));
          }
          paVar22[lVar15] = sVar8 + uVar4;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 7);
        pFVar6->cfl_sign_cdf[8] = pFVar6->cfl_sign_cdf[8] + (ushort)(uVar13 < 0x20);
      }
      uVar20 = iVar19 + (iVar19 + 1) * 10 + 1;
      iVar17 = (int)uVar20 >> 5;
      if (0x1f < uVar20) {
        paVar22 = pFVar6->cfl_sign_cdf + lVar25 * 0x11 + -0x19;
        od_ec_encode_cdf_q15(poVar1,(uint)(bVar12 >> 4),paVar22,0x10);
        if (w->allow_update_cdf != '\0') {
          uVar13 = pFVar6->cfl_sign_cdf[lVar25 * 0x11 + -9];
          bVar11 = (char)(uVar13 >> 4) + 5;
          uVar16 = 0;
          do {
            uVar4 = paVar22[uVar16];
            if (uVar16 < bVar12 >> 4) {
              sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar11 & 0x1f));
            }
            else {
              sVar8 = -(uVar4 >> (bVar11 & 0x1f));
            }
            paVar22[uVar16] = sVar8 + uVar4;
            uVar16 = uVar16 + 1;
          } while (uVar16 != 0xf);
          pFVar6->cfl_sign_cdf[lVar25 * 0x11 + -9] =
               pFVar6->cfl_sign_cdf[lVar25 * 0x11 + -9] + (ushort)(uVar13 < 0x20);
        }
      }
      iVar19 = iVar19 + 1 + iVar17 * -3;
      if (iVar19 != 0) {
        iVar19 = iVar19 * 3 + iVar17 + -3;
        icdf_00 = pFVar6->cfl_alpha_cdf + iVar19;
        od_ec_encode_cdf_q15(poVar1,bVar12 & 0xf,*icdf_00,0x10);
        if (w->allow_update_cdf != '\0') {
          uVar13 = pFVar6->cfl_alpha_cdf[iVar19][0x10];
          bVar11 = (char)(uVar13 >> 4) + 5;
          uVar16 = 0;
          do {
            uVar4 = (*icdf_00)[uVar16];
            if (uVar16 < (bVar12 & 0xf)) {
              sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar11 & 0x1f));
            }
            else {
              sVar8 = -(uVar4 >> (bVar11 & 0x1f));
            }
            (*icdf_00)[uVar16] = sVar8 + uVar4;
            uVar16 = uVar16 + 1;
          } while (uVar16 != 0xf);
          paVar22 = pFVar6->cfl_alpha_cdf[iVar19] + 0x10;
          *paVar22 = *paVar22 + (ushort)(uVar13 < 0x20);
        }
      }
    }
    if ((BLOCK_8X4 < BVar2) && (bVar12 = get_uv_mode_uv2y[bVar10], 0xf7 < (byte)(bVar12 - 9))) {
      paaVar18 = pFVar6->angle_delta_cdf + ((ulong)bVar12 - 1);
      iVar19 = pMVar7->angle_delta[1] + 3;
      od_ec_encode_cdf_q15(poVar1,iVar19,*paaVar18,7);
      if (w->allow_update_cdf != '\0') {
        uVar13 = pFVar6->angle_delta_cdf[(ulong)bVar12 - 1][7];
        bVar10 = (char)(uVar13 >> 4) + 5;
        lVar25 = 0;
        do {
          uVar4 = (*paaVar18)[lVar25];
          if (lVar25 < (char)iVar19) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar10 & 0x1f));
          }
          else {
            sVar8 = -(uVar4 >> (bVar10 & 0x1f));
          }
          (*paaVar18)[lVar25] = sVar8 + uVar4;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 6);
        paVar22 = pFVar6->angle_delta_cdf[(ulong)bVar12 - 1] + 7;
        *paVar22 = *paVar22 + (ushort)(uVar13 < 0x20);
      }
    }
  }
  if (((cm->features).allow_screen_content_tools != false) &&
     ((BLOCK_128X128 < BVar2 || ((0xe007U >> (BVar2 & 0x1f) & 1) == 0)))) {
    uVar3 = cm->seq_params->monochrome;
    bVar12 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[pMVar7->bsize];
    iVar19 = bVar12 - 6;
    if (pMVar7->mode == '\0') {
      uVar20 = 0;
      if (xd->above_mbmi != (MB_MODE_INFO *)0x0) {
        uVar20 = (uint)((xd->above_mbmi->palette_mode_info).palette_size[0] != '\0');
      }
      bVar10 = (pMVar7->palette_mode_info).palette_size[0];
      if (xd->left_mbmi != (MB_MODE_INFO *)0x0) {
        uVar20 = (uVar20 + 1) - (uint)((xd->left_mbmi->palette_mode_info).palette_size[0] == '\0');
      }
      pFVar6 = xd->tile_ctx;
      paaVar14 = pFVar6->palette_y_mode_cdf[(ulong)bVar12 - 6] + uVar20;
      poVar1 = &w->ec;
      od_ec_encode_cdf_q15(poVar1,(uint)(bVar10 != 0),*paaVar14,2);
      uVar23 = (uint)bVar10;
      if (w->allow_update_cdf != '\0') {
        uVar13 = pFVar6->palette_y_mode_cdf[(ulong)bVar12 - 6][uVar20][2];
        bVar10 = (char)(uVar13 >> 4) + 4;
        uVar4 = (*paaVar14)[0];
        if (uVar23 == 0) {
          sVar8 = -(uVar4 >> (bVar10 & 0x1f));
        }
        else {
          sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar10 & 0x1f));
        }
        (*paaVar14)[0] = sVar8 + uVar4;
        pFVar6->palette_y_mode_cdf[(ulong)bVar12 - 6][uVar20][2] = uVar13 + (uVar13 < 0x20);
      }
      if (uVar23 != 0) {
        pFVar6 = xd->tile_ctx;
        paaVar18 = pFVar6->palette_y_size_cdf + ((ulong)bVar12 - 6);
        od_ec_encode_cdf_q15(poVar1,uVar23 - 2,*paaVar18,7);
        if (w->allow_update_cdf != '\0') {
          uVar13 = pFVar6->palette_y_size_cdf[(ulong)bVar12 - 6][7];
          bVar10 = (char)(uVar13 >> 4) + 5;
          lVar25 = 0;
          do {
            uVar4 = (*paaVar18)[lVar25];
            if (lVar25 < (char)(uVar23 - 2)) {
              sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar10 & 0x1f));
            }
            else {
              sVar8 = -(uVar4 >> (bVar10 & 0x1f));
            }
            (*paaVar18)[lVar25] = sVar8 + uVar4;
            lVar25 = lVar25 + 1;
          } while (lVar25 != 6);
          paVar22 = pFVar6->palette_y_size_cdf[(ulong)bVar12 - 6] + 7;
          *paVar22 = *paVar22 + (ushort)(uVar13 < 0x20);
        }
        aVar5 = cm->seq_params->bit_depth;
        bVar12 = (pMVar7->palette_mode_info).palette_size[0];
        uVar20 = av1_get_palette_cache(xd,0,local_58);
        iVar17 = av1_index_color_cache
                           (local_58,uVar20,(pMVar7->palette_mode_info).palette_colors,(uint)bVar12,
                            local_98,local_78);
        if ((0 < (int)uVar20) && (bVar12 != 0)) {
          uVar23 = 0;
          uVar16 = 1;
          do {
            bVar10 = local_98[uVar16 - 1];
            od_ec_encode_bool_q15(poVar1,(uint)bVar10,0x4000);
            if (uVar20 <= uVar16) break;
            uVar23 = uVar23 + bVar10;
            uVar16 = uVar16 + 1;
          } while (uVar23 < bVar12);
        }
        delta_encode_palette_colors(local_78,iVar17,aVar5,1,w);
      }
    }
    if (((uVar3 == '\0') && (pMVar7->uv_mode == '\0')) && (xd->is_chroma_ref == true)) {
      bVar12 = (pMVar7->palette_mode_info).palette_size[1];
      paaVar14 = xd->tile_ctx->palette_uv_mode_cdf +
                 ((pMVar7->palette_mode_info).palette_size[0] != '\0');
      poVar1 = &w->ec;
      od_ec_encode_cdf_q15(poVar1,(uint)(bVar12 != 0),*paaVar14,2);
      uVar20 = (uint)bVar12;
      if (w->allow_update_cdf != '\0') {
        uVar13 = (*paaVar14)[2];
        bVar12 = (char)(uVar13 >> 4) + 4;
        uVar4 = (*paaVar14)[0];
        if (uVar20 == 0) {
          sVar8 = -(uVar4 >> (bVar12 & 0x1f));
        }
        else {
          sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar12 & 0x1f));
        }
        (*paaVar14)[0] = sVar8 + uVar4;
        (*paaVar14)[2] = uVar13 + (uVar13 < 0x20);
      }
      if (uVar20 != 0) {
        pFVar6 = xd->tile_ctx;
        paaVar18 = pFVar6->palette_uv_size_cdf + iVar19;
        od_ec_encode_cdf_q15(poVar1,uVar20 - 2,*paaVar18,7);
        if (w->allow_update_cdf != '\0') {
          uVar13 = pFVar6->palette_uv_size_cdf[iVar19][7];
          bVar12 = (char)(uVar13 >> 4) + 5;
          lVar25 = 0;
          do {
            uVar4 = (*paaVar18)[lVar25];
            if (lVar25 < (char)(uVar20 - 2)) {
              sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar12 & 0x1f));
            }
            else {
              sVar8 = -(uVar4 >> (bVar12 & 0x1f));
            }
            (*paaVar18)[lVar25] = sVar8 + uVar4;
            lVar25 = lVar25 + 1;
          } while (lVar25 != 6);
          paVar22 = pFVar6->palette_uv_size_cdf[iVar19] + 7;
          *paVar22 = *paVar22 + (ushort)(uVar13 < 0x20);
        }
        aVar5 = cm->seq_params->bit_depth;
        bVar12 = (pMVar7->palette_mode_info).palette_size[1];
        uVar16 = (ulong)bVar12;
        uVar20 = av1_get_palette_cache(xd,1,local_58);
        iVar19 = av1_index_color_cache
                           (local_58,uVar20,(pMVar7->palette_mode_info).palette_colors + 8,
                            (uint)bVar12,local_98,local_78);
        if ((0 < (int)uVar20) && (bVar12 != 0)) {
          uVar23 = 0;
          uVar26 = 1;
          do {
            bVar10 = local_98[uVar26 - 1];
            od_ec_encode_bool_q15(poVar1,(uint)bVar10,0x4000);
            if (uVar20 <= uVar26) break;
            uVar23 = uVar23 + bVar10;
            uVar26 = uVar26 + 1;
            local_e0 = (uint)bVar12;
          } while (uVar23 < local_e0);
        }
        delta_encode_palette_colors(local_78,iVar19,aVar5,0,w);
        local_7c = 0;
        local_9c = 0;
        iVar19 = av1_get_palette_delta_bits_v(&pMVar7->palette_mode_info,aVar5,&local_7c,&local_9c);
        uVar20 = iVar19 + 1;
        if ((int)((bVar12 - 1) * uVar20 + (aVar5 - local_7c) + 2) < (int)(aVar5 * bVar12)) {
          od_ec_encode_bool_q15(poVar1,1,0x4000);
          uVar23 = iVar19 - local_9c;
          uVar24 = 3;
          do {
            od_ec_encode_bool_q15(poVar1,(uint)((uVar23 >> (uVar24 - 2 & 0x1f) & 1) != 0),0x4000);
            uVar24 = uVar24 - 1;
          } while (1 < uVar24);
          if (0 < (int)aVar5) {
            uVar13 = (pMVar7->palette_mode_info).palette_colors[0x10];
            uVar23 = aVar5 + 1;
            do {
              od_ec_encode_bool_q15(poVar1,(uint)((uVar13 >> (uVar23 - 2 & 0x1f) & 1) != 0),0x4000);
              uVar23 = uVar23 - 1;
            } while (1 < uVar23);
          }
          if (1 < bVar12) {
            uVar26 = 1;
            do {
              uVar13 = (pMVar7->palette_mode_info).palette_colors[uVar26 + 0x10];
              uVar4 = (pMVar7->palette_mode_info).palette_colors[uVar26 + 0xf];
              if (uVar13 == uVar4) {
                uVar23 = uVar20;
                if (0 < iVar19) {
                  do {
                    od_ec_encode_bool_q15(poVar1,0,0x4000);
                    uVar23 = uVar23 - 1;
                  } while (1 < uVar23);
                }
              }
              else {
                uVar24 = (uint)uVar13 - (uint)uVar4;
                uVar23 = -uVar24;
                if (0 < (int)uVar24) {
                  uVar23 = uVar24;
                }
                bVar27 = uVar13 < uVar4;
                uVar24 = (1 << ((byte)aVar5 & 0x1f)) - uVar23;
                if ((int)uVar24 < (int)uVar23) {
                  uVar23 = uVar20;
                  if (0 < iVar19) {
                    do {
                      od_ec_encode_bool_q15
                                (poVar1,(uint)((uVar24 >> (uVar23 - 2 & 0x1f) & 1) != 0),0x4000);
                      uVar23 = uVar23 - 1;
                    } while (1 < uVar23);
                  }
                  bVar27 = uVar4 <= uVar13;
                }
                else {
                  uVar24 = uVar20;
                  if (0 < iVar19) {
                    do {
                      od_ec_encode_bool_q15
                                (poVar1,(uint)((uVar23 >> (uVar24 - 2 & 0x1f) & 1) != 0),0x4000);
                      uVar24 = uVar24 - 1;
                    } while (1 < uVar24);
                  }
                }
                od_ec_encode_bool_q15(poVar1,(uint)bVar27,0x4000);
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar16);
          }
        }
        else {
          od_ec_encode_bool_q15(poVar1,0,0x4000);
          if (uVar16 != 0) {
            uVar26 = 0;
            do {
              if (0 < (int)aVar5) {
                uVar13 = (pMVar7->palette_mode_info).palette_colors[uVar26 + 0x10];
                uVar20 = aVar5 + 1;
                do {
                  od_ec_encode_bool_q15
                            (poVar1,(uint)((uVar13 >> (uVar20 - 2 & 0x1f) & 1) != 0),0x4000);
                  uVar20 = uVar20 - 1;
                } while (1 < uVar20);
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar16);
          }
        }
      }
    }
  }
  if (((pMVar7->mode == '\0') && ((pMVar7->palette_mode_info).palette_size[0] == '\0')) &&
     ((uVar16 = (ulong)pMVar7->bsize, uVar16 != 0xff &&
      (((cm->seq_params->enable_filter_intra != '\0' && ((0x1f07ffUL >> (uVar16 & 0x3f) & 1) != 0))
       && ((0x2f0bffUL >> (uVar16 & 0x3f) & 1) != 0)))))) {
    bVar12 = (pMVar7->filter_intra_mode_info).use_filter_intra;
    paaVar14 = xd->tile_ctx->filter_intra_cdfs + uVar16;
    od_ec_encode_cdf_q15(&w->ec,(uint)bVar12,*paaVar14,2);
    if (w->allow_update_cdf != '\0') {
      uVar13 = (*paaVar14)[2];
      bVar10 = (char)(uVar13 >> 4) + 4;
      uVar4 = (*paaVar14)[0];
      if ((char)bVar12 < '\x01') {
        sVar8 = -(uVar4 >> (bVar10 & 0x1f));
      }
      else {
        sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar10 & 0x1f));
      }
      (*paaVar14)[0] = sVar8 + uVar4;
      (*paaVar14)[2] = uVar13 + (uVar13 < 0x20);
    }
    if ((pMVar7->filter_intra_mode_info).use_filter_intra != '\0') {
      bVar12 = (pMVar7->filter_intra_mode_info).filter_intra_mode;
      pFVar6 = xd->tile_ctx;
      paVar22 = pFVar6->filter_intra_mode_cdf;
      od_ec_encode_cdf_q15(&w->ec,(uint)bVar12,paVar22,5);
      if (w->allow_update_cdf != '\0') {
        uVar13 = pFVar6->filter_intra_mode_cdf[5];
        bVar10 = (char)(uVar13 >> 4) + 5;
        lVar25 = 0;
        do {
          uVar4 = paVar22[lVar25];
          if (lVar25 < (char)bVar12) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar10 & 0x1f));
          }
          else {
            sVar8 = -(uVar4 >> (bVar10 & 0x1f));
          }
          paVar22[lVar25] = sVar8 + uVar4;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
        pFVar6->filter_intra_mode_cdf[5] =
             pFVar6->filter_intra_mode_cdf[5] + (ushort)(uVar13 < 0x20);
      }
    }
  }
  return;
}

Assistant:

static inline void write_intra_prediction_modes(const AV1_COMMON *cm,
                                                MACROBLOCKD *const xd,
                                                int is_keyframe,
                                                aom_writer *w) {
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const PREDICTION_MODE mode = mbmi->mode;
  const BLOCK_SIZE bsize = mbmi->bsize;

  // Y mode.
  if (is_keyframe) {
    const MB_MODE_INFO *const above_mi = xd->above_mbmi;
    const MB_MODE_INFO *const left_mi = xd->left_mbmi;
    write_intra_y_mode_kf(ec_ctx, mbmi, above_mi, left_mi, mode, w);
  } else {
    write_intra_y_mode_nonkf(ec_ctx, bsize, mode, w);
  }

  // Y angle delta.
  const int use_angle_delta = av1_use_angle_delta(bsize);
  if (use_angle_delta && av1_is_directional_mode(mode)) {
    write_angle_delta(w, mbmi->angle_delta[PLANE_TYPE_Y],
                      ec_ctx->angle_delta_cdf[mode - V_PRED]);
  }

  // UV mode and UV angle delta.
  if (!cm->seq_params->monochrome && xd->is_chroma_ref) {
    const UV_PREDICTION_MODE uv_mode = mbmi->uv_mode;
    write_intra_uv_mode(ec_ctx, uv_mode, mode, is_cfl_allowed(xd), w);
    if (uv_mode == UV_CFL_PRED)
      write_cfl_alphas(ec_ctx, mbmi->cfl_alpha_idx, mbmi->cfl_alpha_signs, w);
    const PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
    if (use_angle_delta && av1_is_directional_mode(intra_mode)) {
      write_angle_delta(w, mbmi->angle_delta[PLANE_TYPE_UV],
                        ec_ctx->angle_delta_cdf[intra_mode - V_PRED]);
    }
  }

  // Palette.
  if (av1_allow_palette(cm->features.allow_screen_content_tools, bsize)) {
    write_palette_mode_info(cm, xd, mbmi, w);
  }

  // Filter intra.
  write_filter_intra_mode_info(cm, xd, mbmi, w);
}